

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Convolution2D.cpp
# Opt level: O2

void __thiscall layer::Convolution2D::predict(Convolution2D *this)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  longdouble *plVar9;
  tensor ppplVar10;
  tensor *pppplVar11;
  undefined1 auVar12 [16];
  long lVar13;
  long lVar14;
  long lVar15;
  uint uVar16;
  scalar *psVar17;
  uint uVar18;
  ulong uVar19;
  int posZOut;
  long lVar20;
  longdouble in_ST0;
  longdouble in_ST1;
  longdouble lVar21;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  longdouble lVar22;
  undefined6 in_stack_ffffffffffffff92;
  
  for (lVar20 = 0; lVar20 < (this->super_Layer)._sizeZOut; lVar20 = lVar20 + 1) {
    for (lVar13 = 0; lVar13 < (this->super_Layer)._sizeYOut; lVar13 = lVar13 + 1) {
      for (lVar15 = 0; lVar15 < (this->super_Layer)._sizeXOut; lVar15 = lVar15 + 1) {
        plVar9 = (this->super_Layer)._out[lVar20][lVar13];
        lVar21 = (longdouble)0;
        plVar9[lVar15] = lVar21;
        uVar1 = (this->super_Layer)._sizeYWeight;
        uVar2 = (this->super_Layer)._sizeZWeight;
        iVar3 = this->_stepY;
        iVar4 = this->_zeroPaddingY;
        if ((int)uVar1 < 1) {
          uVar1 = 0;
        }
        if ((int)uVar2 < 1) {
          uVar2 = 0;
        }
        lVar22 = in_ST5;
        for (psVar17 = (scalar *)0x0; psVar17 != (scalar *)(ulong)uVar2;
            psVar17 = (scalar *)((long)psVar17 + 1)) {
          iVar5 = this->_stepX;
          iVar6 = this->_zeroPaddingX;
          uVar7 = (this->super_Layer)._sizeXWeight;
          if ((int)uVar7 < 1) {
            uVar7 = 0;
          }
          iVar8 = this->_sizeYIn;
          uVar16 = iVar3 * (int)lVar13 - iVar4;
          for (uVar19 = 0; uVar19 != uVar1; uVar19 = uVar19 + 1) {
            if ((int)uVar16 < iVar8 && -1 < (int)uVar16) {
              ppplVar10 = (this->super_Layer)._in;
              pppplVar11 = (this->super_Layer)._ptrWeight;
              uVar18 = iVar5 * (int)lVar15 - iVar6;
              for (lVar14 = 0; (ulong)uVar7 * 0x10 != lVar14; lVar14 = lVar14 + 0x10) {
                if ((int)uVar18 < iVar8 && -1 < (int)uVar18) {
                  lVar21 = ppplVar10[(long)psVar17][uVar16][uVar18] *
                           *(longdouble *)((long)pppplVar11[lVar20][(long)psVar17][uVar19] + lVar14)
                           + lVar21;
                  plVar9[lVar15] = lVar21;
                  lVar22 = in_ST4;
                  in_ST5 = in_ST4;
                }
                uVar18 = uVar18 + 1;
              }
            }
            uVar16 = uVar16 + 1;
          }
        }
        auVar12._10_6_ = in_stack_ffffffffffffff92;
        auVar12._0_10_ = lVar21;
        (*(this->super_Layer)._fActivation)(psVar17,(scalar)auVar12);
        (this->super_Layer)._out[lVar20][lVar13][lVar15] = in_ST0;
        in_ST0 = in_ST1;
        in_ST1 = in_ST2;
        in_ST2 = in_ST3;
        in_ST3 = in_ST4;
        in_ST4 = lVar22;
      }
    }
  }
  return;
}

Assistant:

void Convolution2D::predict()
    {
        int posXIn = 0;
        int posYIn = 0;


        for (int posZOut(0); posZOut < _sizeZOut; posZOut++) {
            for (int posYOut(0); posYOut < _sizeYOut; posYOut++) {
                for (int posXOut(0); posXOut < _sizeXOut; posXOut++) {
                    _out[posZOut][posYOut][posXOut] = 0;

                    for (int posZKernel(0); posZKernel < _sizeZWeight; posZKernel++) {
                        posYIn = (posYOut * _stepY) - _zeroPaddingY;
                        for (int posYKernel(0); posYKernel < _sizeYWeight; posYKernel++) {
                            if((posYIn >= 0) & (posYIn < _sizeYIn)) {
                                posXIn = (posXOut * _stepX) - _zeroPaddingX;
                                for (int posXKernel(0); posXKernel < _sizeXWeight; posXKernel++) {
                                    if((posXIn >= 0) & (posXIn < _sizeYIn)) {
                                        _out[posZOut][posYOut][posXOut] +=
                                                _ptrWeight[posZOut][posZKernel][posYKernel][posXKernel] *
                                                _in[posZKernel][posYIn][posXIn];
                                    }
                                    posXIn++;
                                }
                            }
                            posYIn++;
                        }
                    }
                    _out[posZOut][posYOut][posXOut] = _fActivation(_out[posZOut][posYOut][posXOut]);

                }
            }
        }
    }